

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.h
# Opt level: O2

void __thiscall pbrt::DisneyMaterial::DisneyMaterial(DisneyMaterial *this,string *name)

{
  Material::Material(&this->super_Material,name);
  (this->super_Material).super_Entity._vptr_Entity = (_func_int **)&PTR_toString_abi_cxx11__00167438
  ;
  this->anisotropic = 0.0;
  this->clearCoat = 0.0;
  this->clearCoatGloss = 1.0;
  (this->color).x = 0.5;
  (this->color).y = 0.5;
  (this->color).z = 0.5;
  this->diffTrans = 1.0;
  this->eta = 1.5;
  this->flatness = 0.0;
  this->metallic = 0.0;
  this->roughness = 0.5;
  this->sheen = 0.0;
  this->sheenTint = 0.5;
  this->specTrans = 0.0;
  this->specularTint = 0.0;
  this->thin = false;
  return;
}

Assistant:

DisneyMaterial(const std::string &name = "") : Material(name) {}